

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3_print.h
# Opt level: O0

int grisu3_i_to_str(int val,char *str)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char ch;
  int digit;
  int ni;
  char *begin;
  char *s;
  int i;
  int len;
  char *str_local;
  int val_local;
  
  _i = str;
  str_local._4_4_ = val;
  if (val < 0) {
    _i = str + 1;
    *str = '-';
    str_local._4_4_ = -val;
  }
  begin = _i;
  do {
    iVar2 = str_local._4_4_ / 10;
    pcVar3 = begin + 1;
    *begin = (char)(str_local._4_4_ % 10) + '0';
    begin = pcVar3;
    str_local._4_4_ = iVar2;
  } while (iVar2 != 0);
  *pcVar3 = '\0';
  iVar2 = (int)pcVar3 - (int)_i;
  for (s._0_4_ = 0; (int)s < iVar2 / 2; s._0_4_ = (int)s + 1) {
    cVar1 = _i[(int)s];
    _i[(int)s] = _i[(iVar2 + -1) - (int)s];
    _i[(iVar2 + -1) - (int)s] = cVar1;
  }
  return (int)pcVar3 - (int)str;
}

Assistant:

static int grisu3_i_to_str(int val, char *str)
{
    int len, i;
    char *s;
    char *begin = str;
    if (val < 0) { *str++ = '-'; val = -val; }
    s = str;

    for(;;)
    {
        int ni = val / 10;
        int digit = val - ni*10;
        *s++ = (char)('0' + digit);
        if (ni == 0)
            break;
        val = ni;
    }
    *s = '\0';
    len = (int)(s - str);
    for(i = 0; i < len/2; ++i)
    {
        char ch = str[i];
        str[i] = str[len-1-i];
        str[len-1-i] = ch;
    }

    return (int)(s - begin);
}